

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::EventFunctionChecker::visit(EventFunctionChecker *this,Processor *p)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  Function *pFVar4;
  EndpointDetails *this_00;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 o;
  pointer pTVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppVar11;
  long lVar12;
  long *extraout_RDX;
  long *extraout_RDX_00;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  pointer ppVar13;
  Identifier *in_R9;
  pool_ref<soul::AST::VariableDeclaration> *v;
  pointer ppVar14;
  pointer ppVar15;
  pointer ppVar16;
  pointer other;
  Type *t;
  Type *other_00;
  Type eventType;
  vector<soul::Type,_std::allocator<soul::Type>_> types;
  DuplicateNameChecker duplicateNameChecker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  Type local_1c0;
  Processor *local_1a8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  vector<soul::Type,_std::allocator<soul::Type>_> local_180;
  DuplicateNameChecker local_168;
  pointer local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  long *plVar10;
  
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  local_168.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8 = p;
  iVar9 = (*(p->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[8])(p);
  plVar10 = (long *)CONCAT44(extraout_var,iVar9);
  if (plVar10 != extraout_RDX) {
    do {
      soul::DuplicateNameChecker::check<soul::AST::Context&>
                (&local_168,*(string **)(*plVar10 + 0x30),(Context *)(*plVar10 + 0x10));
      plVar10 = plVar10 + 1;
    } while (plVar10 != extraout_RDX);
  }
  ppVar14 = (local_1a8->stateVariables).
            super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (local_1a8->stateVariables).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar14 != ppVar1) {
    do {
      soul::DuplicateNameChecker::check<soul::AST::Context&>
                (&local_168,(ppVar14->object->name).name,
                 &(ppVar14->object->super_Statement).super_ASTObject.context);
      ppVar14 = ppVar14 + 1;
    } while (ppVar14 != ppVar1);
  }
  ppVar15 = (local_1a8->super_ProcessorBase).super_ModuleBase.structures.
            super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (local_1a8->super_ProcessorBase).super_ModuleBase.structures.
           super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar15 != ppVar2) {
    do {
      soul::DuplicateNameChecker::check<soul::AST::Context&>
                (&local_168,(ppVar15->object->super_TypeDeclarationBase).name.name,
                 &(ppVar15->object->super_TypeDeclarationBase).super_Expression.super_Statement.
                  super_ASTObject.context);
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != ppVar2);
  }
  ppVar16 = (local_1a8->super_ProcessorBase).super_ModuleBase.usings.
            super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (local_1a8->super_ProcessorBase).super_ModuleBase.usings.
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar16 != ppVar3) {
    do {
      soul::DuplicateNameChecker::check<soul::AST::Context&>
                (&local_168,(ppVar16->object->super_TypeDeclarationBase).name.name,
                 &(ppVar16->object->super_TypeDeclarationBase).super_Expression.super_Statement.
                  super_ASTObject.context);
      ppVar16 = ppVar16 + 1;
    } while (ppVar16 != ppVar3);
  }
  ppVar11 = (local_1a8->functions).
            super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar13 = (local_1a8->functions).
            super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar11 != ppVar13) {
    local_150 = ppVar13;
    do {
      if (ppVar11->object->eventFunction == true) {
        iVar9 = (*(local_1a8->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject
                  [8])();
        plVar10 = (long *)CONCAT44(extraout_var_00,iVar9);
        if (plVar10 == extraout_RDX_00) {
LAB_00232724:
          pFVar4 = ppVar11->object;
          CompileMessageHelpers::createMessage<soul::Identifier&>
                    (&local_148,(CompileMessageHelpers *)0x1,none,0x2a29db,(char *)&pFVar4->name,
                     in_R9);
          AST::Context::throwError(&(pFVar4->super_ASTObject).context,&local_148,false);
        }
        bVar8 = false;
        do {
          lVar12 = *plVar10;
          if ((*(char *)(lVar12 + 0x28) == '\x01') &&
             (pFVar4 = ppVar11->object, *(string **)(lVar12 + 0x30) == (pFVar4->name).name)) {
            this_00 = *(EndpointDetails **)(lVar12 + 0x38);
            if (this_00 == (EndpointDetails *)0x0) {
              throwInternalCompilerError("object != nullptr","operator*",0x3b);
            }
            ppVar14 = (pFVar4->parameters).
                      super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar12 = (long)(pFVar4->parameters).
                           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar14;
            if ((this_00->arraySize).object == (Expression *)0x0) {
              if (lVar12 != 8) goto LAB_002326ba;
              AST::VariableDeclaration::getType((Type *)local_1a0,ppVar14->object);
              uVar6 = local_190._M_allocated_capacity;
              if ((Structure *)local_190._M_allocated_capacity == (Structure *)0x0) {
                local_1c0.structure.object = (Structure *)0x0;
              }
              else {
                local_1c0.structure.object = (Structure *)local_190._M_allocated_capacity;
                *(int *)local_190._M_allocated_capacity =
                     *(int *)local_190._M_allocated_capacity + 2;
              }
              local_1c0._0_4_ = local_1a0._0_4_ & 0xffff;
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_190._M_allocated_capacity);
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_190._M_allocated_capacity);
              AST::EndpointDetails::getResolvedDataTypes(&local_180,this_00);
              pTVar7 = local_180.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              other = local_180.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                      super__Vector_impl_data._M_start;
              while( true ) {
                if (other == pTVar7) {
                  pFVar4 = ppVar11->object;
                  Type::getDescription_abi_cxx11_((string *)local_1a0,&local_1c0);
                  CompileMessageHelpers::createMessage<soul::Identifier&,std::__cxx11::string>
                            (&local_68,(CompileMessageHelpers *)0x1,none,0x2a294b,
                             (char *)&pFVar4->name,(Identifier *)local_1a0,in_stack_fffffffffffffe28
                            );
                  AST::Context::throwError(&(pFVar4->super_ASTObject).context,&local_68,false);
                }
                bVar8 = Type::isEqual(&local_1c0,other,0);
                if (bVar8) break;
                other = other + 1;
              }
              std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_180);
              RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)uVar6);
              bVar8 = true;
            }
            else {
              if (lVar12 != 0x10) {
LAB_002326ba:
                CompileMessageHelpers::createMessage<>
                          (&local_110,syntax,error,"Event function arguments invalid");
                AST::Context::throwError(&(pFVar4->super_ASTObject).context,&local_110,false);
              }
              AST::VariableDeclaration::getType((Type *)local_1a0,ppVar14->object);
              uVar6 = local_190._M_allocated_capacity;
              uVar5 = local_1a0._4_4_;
              if ((Structure *)local_190._M_allocated_capacity != (Structure *)0x0) {
                *(int *)local_190._M_allocated_capacity =
                     *(int *)local_190._M_allocated_capacity + 2;
              }
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_190._M_allocated_capacity);
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_190._M_allocated_capacity);
              AST::VariableDeclaration::getType
                        ((Type *)local_1a0,
                         (ppVar11->object->parameters).
                         super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].object);
              o = local_190._M_allocated_capacity;
              if ((Structure *)local_190._M_allocated_capacity == (Structure *)0x0) {
                local_1c0.structure.object = (Structure *)0x0;
              }
              else {
                local_1c0.structure.object = (Structure *)local_190._M_allocated_capacity;
                *(int *)local_190._M_allocated_capacity =
                     *(int *)local_190._M_allocated_capacity + 2;
              }
              local_1c0._0_4_ = local_1a0._0_4_ & 0xffff;
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_190._M_allocated_capacity);
              RefCountedPtr<soul::Structure>::decIfNotNull
                        ((Structure *)local_190._M_allocated_capacity);
              AST::EndpointDetails::getResolvedDataTypes(&local_180,this_00);
              pTVar7 = local_180.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              other_00 = local_180.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              if (1 < uVar5 - int32) {
                pFVar4 = ppVar11->object;
                CompileMessageHelpers::createMessage<>
                          (&local_a0,syntax,error,
                           "Event Handlers for event arrays need a first argument index integer type"
                          );
                AST::Context::throwError(&(pFVar4->super_ASTObject).context,&local_a0,false);
              }
              while( true ) {
                if (other_00 == pTVar7) {
                  pFVar4 = ppVar11->object;
                  Type::getDescription_abi_cxx11_((string *)local_1a0,&local_1c0);
                  CompileMessageHelpers::createMessage<soul::Identifier&,std::__cxx11::string>
                            (&local_d8,(CompileMessageHelpers *)0x1,none,0x2a294b,
                             (char *)&pFVar4->name,(Identifier *)local_1a0,in_stack_fffffffffffffe28
                            );
                  AST::Context::throwError(&(pFVar4->super_ASTObject).context,&local_d8,false);
                }
                bVar8 = Type::isEqual(&local_1c0,other_00,0);
                if (bVar8) break;
                other_00 = other_00 + 1;
              }
              std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_180);
              RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)o);
              bVar8 = true;
              RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)uVar6);
            }
          }
          plVar10 = plVar10 + 1;
        } while (plVar10 != extraout_RDX_00);
        ppVar13 = local_150;
        if (!bVar8) goto LAB_00232724;
      }
      ppVar11 = ppVar11 + 1;
    } while (ppVar11 != ppVar13);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168.names);
  return;
}

Assistant:

void visit (AST::Processor& p) override
        {
            super::visit (p);

            soul::DuplicateNameChecker duplicateNameChecker;

            for (auto& e : p.getEndpoints())   duplicateNameChecker.check (e->name, e->context);
            for (auto& v : p.stateVariables)   duplicateNameChecker.check (v->name, v->context);
            for (auto& s : p.structures)       duplicateNameChecker.check (s->name, s->context);
            for (auto& u : p.usings)           duplicateNameChecker.check (u->name, u->context);

            // (functions must be scanned last)
            for (auto& f : p.functions)
            {
                if (f->isEventFunction())
                {
                    bool nameFound = false;

                    for (auto& e : p.getEndpoints())
                    {
                        if (e->isInput && e->name == f->name)
                        {
                            nameFound = true;
                            const auto& details = e->getDetails();

                            if (details.arraySize == nullptr && f->parameters.size() == 1)
                            {
                                auto eventType = f->parameters.front()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto types = details.getResolvedDataTypes();

                                if (! eventType.isPresentIn (types))
                                    f->context.throwError (Errors::eventFunctionInvalidType (f->name, eventType.getDescription()));
                            }
                            else if (details.arraySize != nullptr && f->parameters.size() == 2)
                            {
                                auto indexType = f->parameters.front()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto eventType = f->parameters.back()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto types = details.getResolvedDataTypes();

                                if (! indexType.isInteger())
                                    f->context.throwError (Errors::eventFunctionIndexInvalid());

                               if (! eventType.isPresentIn (types))
                                   f->context.throwError (Errors::eventFunctionInvalidType (f->name, eventType.getDescription()));
                            }
                            else
                            {
                                f->context.throwError (Errors::eventFunctionInvalidArguments());
                            }
                        }
                   }

                    if (! nameFound)
                        f->context.throwError (Errors::noSuchInputEvent (f->name));
                }
            }
        }